

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O2

void __thiscall nn::ESoinn::SealNeuronVector(ESoinn *this)

{
  ConcreteLogger *this_00;
  pointer pEVar1;
  pointer pEVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t number_new;
  allocator local_78 [8];
  runtime_error anon_var_0;
  undefined1 auStack_58 [8];
  vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> newNeurons;
  
  this_00 = log_netw;
  std::__cxx11::string::string((string *)auStack_58,"SealNeuronVector function",local_78);
  number_new = 0;
  logger::ConcreteLogger::debug(this_00,(string *)auStack_58,false);
  std::__cxx11::string::~string((string *)auStack_58);
  newNeurons.super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  newNeurons.super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  pEVar2 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_start;
  pEVar1 = (this->m_Neurons).
           super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (uVar5 = 0; (ulong)uVar5 < (ulong)(((long)pEVar1 - (long)pEVar2) / 0x88); uVar5 = uVar5 + 1) {
    if (pEVar2[uVar5].m_IsDeleted == false) {
      if (uVar5 != number_new) {
        for (uVar3 = 0; uVar4 = (ulong)uVar3, uVar4 < (ulong)(((long)pEVar1 - (long)pEVar2) / 0x88);
            uVar3 = uVar3 + 1) {
          if (pEVar2[uVar4].m_IsDeleted == false) {
            neuron::ESoinnNeuron::replaceNeighbour(pEVar2 + uVar4,uVar5,number_new,true);
          }
          pEVar2 = (this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pEVar1 = (this->m_Neurons).
                   super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        }
      }
      number_new = number_new + 1;
    }
  }
  for (uVar5 = 0; uVar4 = (ulong)uVar5, uVar4 < (ulong)(((long)pEVar1 - (long)pEVar2) / 0x88);
      uVar5 = uVar5 + 1) {
    if (pEVar2[uVar4].m_IsDeleted == false) {
      std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::push_back
                ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58,
                 pEVar2 + uVar4);
      pEVar2 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar1 = (this->m_Neurons).
               super__Vector_base<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    }
  }
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::operator=
            (&this->m_Neurons,
             (vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58);
  std::vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_>::~vector
            ((vector<neuron::ESoinnNeuron,_std::allocator<neuron::ESoinnNeuron>_> *)auStack_58);
  return;
}

Assistant:

void ESoinn::SealNeuronVector()
    {
        log_netw->debug("SealNeuronVector function");
        std::vector<neuron::ESoinnNeuron> newNeurons;
        uint32_t count_notnull = 0;
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            if (i == count_notnull)
            {
                count_notnull++;
                continue;
            }
            //newNeurons.push_back(m_Neurons[i]);
            for (uint32_t j = 0; j < m_Neurons.size(); j++)
            {
                if (m_Neurons[j].is_deleted())
                    continue;
                try
                {
                    m_Neurons[j].replaceNeighbour(i, count_notnull, true);    
                }
                catch (std::runtime_error)
                {
                }
            }
            count_notnull++;    
        }
        
        for (uint32_t i = 0; i < m_Neurons.size(); i++)
        {
            if (m_Neurons[i].is_deleted())
                continue;
            newNeurons.push_back(m_Neurons[i]);
        }
        m_Neurons = newNeurons;        
    }